

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_to(cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
       basic_item_event_visitor<char> *visitor)

{
  ser_error *this_00;
  undefined8 extraout_RAX;
  error_code ec_00;
  error_code ec;
  uint local_28 [2];
  error_category *local_20;
  
  local_28[0] = 0;
  local_20 = (error_category *)std::_V2::system_category();
  (*(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[6])
            (this,visitor,local_28);
  if (local_28[0] == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_28[0];
  ec_00._M_cat = local_20;
  ser_error::ser_error(this_00,ec_00,0,(this->parser_).source_.position_);
  cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_to
            ((cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void read_to(basic_item_event_visitor<char_type>& visitor) override
        {
            std::error_code ec;
            read_to(visitor, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }